

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.cpp
# Opt level: O1

double __thiscall NetworkNS::RanMars::modified_gaussian(RanMars *this,double mean,double stdev)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  if (this->save == 0) {
    do {
      do {
        dVar2 = uniform(this);
        dVar4 = dVar2 + dVar2 + -1.0;
        dVar2 = uniform(this);
        dVar2 = dVar2 + dVar2 + -1.0;
        dVar5 = dVar4 * dVar4 + dVar2 * dVar2;
      } while (1.0 <= dVar5);
    } while ((dVar5 == 0.0) && (!NAN(dVar5)));
    dVar3 = log(dVar5);
    dVar5 = (dVar3 * -2.0) / dVar5;
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      dVar5 = SQRT(dVar5);
    }
    this->second = dVar4 * stdev * dVar5 + mean;
    dVar2 = dVar2 * stdev * dVar5 + mean;
    iVar1 = 1;
  }
  else {
    dVar2 = this->second;
    iVar1 = 0;
  }
  this->save = iVar1;
  return dVar2;
}

Assistant:

double RanMars::modified_gaussian(double mean, double stdev) {
      double first, v1, v2, rsq, fac;

      if (!save) {
         int again = 1;
         while (again) {
            v1 = 2.0 * uniform() - 1.0;
            v2 = 2.0 * uniform() - 1.0;
            rsq = v1 * v1 + v2*v2;
            if (rsq < 1.0 && rsq != 0.0) again = 0;
         }
         fac = sqrt(-2.0 * log(rsq) / rsq);
         second = mean + stdev * v1*fac;
         first = mean + stdev * v2*fac;
         //cout << "in_marsaglia=" << mean << endl;
         save = 1;
      } else {
         first = second;
         save = 0;
      }
      return first;
   }